

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdicc.c
# Opt level: O3

boolean jpeg_read_icc_profile(j_decompress_ptr cinfo,JOCTET **icc_data_ptr,uint *icc_data_len)

{
  byte bVar1;
  int iVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_saved_marker_ptr marker;
  JOCTET *pJVar4;
  boolean bVar5;
  ulong uVar6;
  JOCTET *pJVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  jpeg_saved_marker_ptr marker_00;
  bool bVar11;
  char marker_present [256];
  uint data_length [256];
  uint data_offset [256];
  char acStack_938 [256];
  int aiStack_838 [256];
  uint auStack_438 [258];
  
  if (icc_data_ptr == (JOCTET **)0x0 || icc_data_len == (uint *)0x0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x17;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  iVar2 = cinfo->global_state;
  if (iVar2 < 0xca) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x14;
    (pjVar3->msg_parm).i[0] = iVar2;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  *icc_data_ptr = (JOCTET *)0x0;
  *icc_data_len = 0;
  memset(acStack_938 + 1,0,0xff);
  marker = cinfo->marker_list;
  if (marker != (jpeg_saved_marker_ptr_conflict)0x0) {
    uVar8 = 0;
    marker_00 = marker;
    do {
      bVar5 = marker_is_icc(marker_00);
      if (bVar5 != 0) {
        uVar10 = (uint)marker_00->data[0xd];
        if ((uVar8 != 0) && (bVar11 = uVar8 != uVar10, uVar10 = uVar8, bVar11)) goto LAB_0010b300;
        bVar1 = marker_00->data[0xc];
        if ((bVar1 == 0) || ((uVar10 < bVar1 || (acStack_938[bVar1] != '\0')))) goto LAB_0010b300;
        acStack_938[bVar1] = '\x01';
        aiStack_838[bVar1] = marker_00->data_length - 0xe;
        uVar8 = uVar10;
      }
      marker_00 = marker_00->next;
    } while (marker_00 != (jpeg_saved_marker_ptr)0x0);
    if (uVar8 != 0) {
      if (uVar8 != 0) {
        uVar10 = 0;
        uVar6 = 1;
        do {
          if (acStack_938[uVar6] == '\0') {
LAB_0010b300:
            pjVar3 = cinfo->err;
            pjVar3->msg_code = 0x7f;
            (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
            return 0;
          }
          auStack_438[uVar6] = uVar10;
          uVar10 = uVar10 + aiStack_838[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar8 + 1 != uVar6);
        if (uVar10 != 0) {
          pJVar7 = (JOCTET *)malloc((ulong)uVar10);
          if (pJVar7 == (JOCTET *)0x0) {
            *(undefined8 *)&cinfo->err->msg_code = 0xb00000036;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            marker = cinfo->marker_list;
          }
          for (; marker != (jpeg_saved_marker_ptr_conflict)0x0; marker = marker->next) {
            bVar5 = marker_is_icc(marker);
            if (bVar5 != 0) {
              pJVar4 = marker->data;
              bVar1 = pJVar4[0xc];
              iVar2 = aiStack_838[bVar1];
              if (iVar2 != 0) {
                uVar8 = auStack_438[bVar1];
                lVar9 = 0;
                do {
                  pJVar7[lVar9 + (ulong)uVar8] = pJVar4[lVar9 + 0xe];
                  lVar9 = lVar9 + 1;
                } while (iVar2 != (int)lVar9);
              }
            }
          }
          *icc_data_ptr = pJVar7;
          *icc_data_len = uVar10;
          return 1;
        }
      }
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x7f;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
    }
  }
  return 0;
}

Assistant:

GLOBAL(boolean)
jpeg_read_icc_profile(j_decompress_ptr cinfo, JOCTET **icc_data_ptr,
                      unsigned int *icc_data_len)
{
  jpeg_saved_marker_ptr marker;
  int num_markers = 0;
  int seq_no;
  JOCTET *icc_data;
  unsigned int total_length;
#define MAX_SEQ_NO  255         /* sufficient since marker numbers are bytes */
  char marker_present[MAX_SEQ_NO + 1];      /* 1 if marker found */
  unsigned int data_length[MAX_SEQ_NO + 1]; /* size of profile data in marker */
  unsigned int data_offset[MAX_SEQ_NO + 1]; /* offset for data in marker */

  if (icc_data_ptr == NULL || icc_data_len == NULL)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  if (cinfo->global_state < DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  *icc_data_ptr = NULL;         /* avoid confusion if FALSE return */
  *icc_data_len = 0;

  /* This first pass over the saved markers discovers whether there are
   * any ICC markers and verifies the consistency of the marker numbering.
   */

  for (seq_no = 1; seq_no <= MAX_SEQ_NO; seq_no++)
    marker_present[seq_no] = 0;

  for (marker = cinfo->marker_list; marker != NULL; marker = marker->next) {
    if (marker_is_icc(marker)) {
      if (num_markers == 0)
        num_markers = marker->data[13];
      else if (num_markers != marker->data[13]) {
        WARNMS(cinfo, JWRN_BOGUS_ICC);  /* inconsistent num_markers fields */
        return FALSE;
      }
      seq_no = marker->data[12];
      if (seq_no <= 0 || seq_no > num_markers) {
        WARNMS(cinfo, JWRN_BOGUS_ICC);  /* bogus sequence number */
        return FALSE;
      }
      if (marker_present[seq_no]) {
        WARNMS(cinfo, JWRN_BOGUS_ICC);  /* duplicate sequence numbers */
        return FALSE;
      }
      marker_present[seq_no] = 1;
      data_length[seq_no] = marker->data_length - ICC_OVERHEAD_LEN;
    }
  }

  if (num_markers == 0)
    return FALSE;

  /* Check for missing markers, count total space needed,
   * compute offset of each marker's part of the data.
   */

  total_length = 0;
  for (seq_no = 1; seq_no <= num_markers; seq_no++) {
    if (marker_present[seq_no] == 0) {
      WARNMS(cinfo, JWRN_BOGUS_ICC);  /* missing sequence number */
      return FALSE;
    }
    data_offset[seq_no] = total_length;
    total_length += data_length[seq_no];
  }

  if (total_length == 0) {
    WARNMS(cinfo, JWRN_BOGUS_ICC);  /* found only empty markers? */
    return FALSE;
  }

  /* Allocate space for assembled data */
  icc_data = (JOCTET *)malloc(total_length * sizeof(JOCTET));
  if (icc_data == NULL)
    ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 11);  /* oops, out of memory */

  /* and fill it in */
  for (marker = cinfo->marker_list; marker != NULL; marker = marker->next) {
    if (marker_is_icc(marker)) {
      JOCTET FAR *src_ptr;
      JOCTET *dst_ptr;
      unsigned int length;
      seq_no = marker->data[12];
      dst_ptr = icc_data + data_offset[seq_no];
      src_ptr = marker->data + ICC_OVERHEAD_LEN;
      length = data_length[seq_no];
      while (length--) {
        *dst_ptr++ = *src_ptr++;
      }
    }
  }

  *icc_data_ptr = icc_data;
  *icc_data_len = total_length;

  return TRUE;
}